

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkgdata.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  char (*pacVar1) [10];
  bool bVar2;
  bool bVar3;
  char cVar4;
  UBool UVar5;
  UBool UVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  int32_t iVar11;
  uint32_t uVar12;
  uint32_t uVar13;
  FILE *pFVar14;
  size_t sVar15;
  FILE *pFVar16;
  CharList *buffer;
  char *installDir;
  CharList *optEntryPoint;
  char *pcVar17;
  CharList *l;
  byte *pbVar18;
  CharList *path;
  size_t sVar19;
  char *pcVar20;
  FileStream *pFVar21;
  size_t sVar22;
  size_t sVar23;
  CharList *pCVar24;
  undefined8 extraout_RAX;
  char cVar25;
  byte bVar26;
  int32_t i_2;
  char *outComment;
  char *__s;
  UErrorCode *pUVar27;
  char *pcVar28;
  char *pcVar29;
  byte *pbVar30;
  char *pcVar31;
  char cVar32;
  char *pcVar33;
  char *pcVar34;
  int32_t i_1;
  CharList *pCVar35;
  long lVar36;
  ulong uVar37;
  char *pcVar38;
  _CharList *p_Var39;
  char **ppcVar40;
  int32_t i;
  bool bVar41;
  char local_62fa;
  char local_62f9;
  CharList *local_62f0;
  undefined8 local_62e8;
  FileStream *local_62d8;
  UBool local_62cc;
  CharList *local_62c0;
  char *local_6298;
  CharList *local_6288;
  char version_major [10];
  CharList *tail;
  char targetDir [512];
  UErrorCode status_1;
  uint local_6030;
  char newName [512];
  char gencFilePath [512];
  UErrorCode status;
  char dataName [512];
  CharString cmdBuf;
  char datFileName [512];
  char local_4c38 [512];
  char cmd [28];
  char tmpDir [512];
  char dirBuf [1024];
  
  progname = *argv;
  options[2].value = "common";
  uVar7 = u_parseArgs(argc,argv,0x16,options);
  bVar41 = options[4].doesOccur == '\0';
  bVar3 = options[3].doesOccur == '\0';
  if (bVar41 && bVar3) {
    if ((int)uVar7 < 0) {
      main_cold_6();
      return 1;
    }
    if ((options[1].doesOccur == '\0') &&
       (iVar8 = strcmp(options[2].value,"common"), cVar32 = options[5].doesOccur, iVar8 != 0)) {
      icu_63::MaybeStackArray<char,_40>::MaybeStackArray(&cmdBuf.buffer);
      cmdBuf.len = 0;
      *cmdBuf.buffer.ptr = '\0';
      status = U_ZERO_ERROR;
      builtin_strncpy(cmd + 0x10,"pkgdatafile",0xc);
      builtin_strncpy(cmd,"icu-config --inc",0x10);
      memset(dirBuf,0,0x400);
      findDirname(progname,dirBuf,0x400,&status);
      if (status < U_ILLEGAL_ARGUMENT_ERROR) {
        icu_63::StringPiece::StringPiece((StringPiece *)&status_1,dirBuf);
        icu_63::CharString::append(&cmdBuf,_status_1,local_6030,&status);
        if (*cmdBuf.buffer.ptr != '\0') {
          icu_63::StringPiece::StringPiece((StringPiece *)newName,"/");
          icu_63::CharString::append
                    (&cmdBuf,(char *)CONCAT44(newName._4_4_,newName._0_4_),newName._8_4_,&status);
        }
        icu_63::StringPiece::StringPiece((StringPiece *)dataName,cmd);
        icu_63::CharString::append
                  (&cmdBuf,(char *)CONCAT71(dataName._1_7_,dataName[0]),dataName._8_4_,&status);
        if (cVar32 != '\0') {
          fprintf(_stdout,"# Calling icu-config: %s\n",cmdBuf.buffer.ptr);
        }
        pFVar14 = popen(cmdBuf.buffer.ptr,"r");
      }
      else {
        pFVar14 = (FILE *)0x0;
      }
      if ((pFVar14 == (FILE *)0x0) ||
         (sVar15 = fread(&pkg_getOptionsFromICUConfig(signed,UOption*)::buf,1,0x1ff,pFVar14),
         sVar15 == 0)) {
        if (cVar32 != '\0') {
          fprintf(_stdout,"# Calling icu-config: %s\n",cmd);
        }
        pFVar16 = popen(cmd,"r");
        if (pFVar14 != (FILE *)0x0) {
          pclose(pFVar14);
        }
        if ((pFVar16 != (FILE *)0x0) &&
           (sVar15 = fread(&pkg_getOptionsFromICUConfig(signed,UOption*)::buf,1,0x1ff,pFVar16),
           pFVar14 = pFVar16, sVar15 != 0)) goto LAB_001e801c;
        main_cold_2();
LAB_001e9a58:
        bVar2 = false;
      }
      else {
LAB_001e801c:
        sVar15 = strlen(&pkg_getOptionsFromICUConfig(signed,UOption*)::buf);
        uVar9 = (int)sVar15 - 1;
        if (-1 < (int)uVar9) {
          uVar37 = (ulong)uVar9;
          do {
            if (((&pkg_getOptionsFromICUConfig(signed,UOption*)::buf)[uVar37] != ' ') &&
               ((&pkg_getOptionsFromICUConfig(signed,UOption*)::buf)[uVar37] != '\n')) break;
            (&pkg_getOptionsFromICUConfig(signed,UOption*)::buf)[uVar37] = 0;
            bVar2 = 0 < (long)uVar37;
            uVar37 = uVar37 - 1;
          } while (bVar2);
        }
        sVar15 = strlen(&pkg_getOptionsFromICUConfig(signed,UOption*)::buf);
        if (libFileNames[3][sVar15 + 0xff] == '\n') {
          libFileNames[3][sVar15 + 0xff] = '\0';
        }
        pFVar16 = pFVar14;
        if (pkg_getOptionsFromICUConfig(signed,UOption*)::buf == '\0') {
          main_cold_1();
          goto LAB_001e9a58;
        }
        if (cVar32 != '\0') {
          fprintf(_stdout,"# icu-config said: %s\n",
                  &pkg_getOptionsFromICUConfig(signed,UOption*)::buf);
        }
        options[1].value = &pkg_getOptionsFromICUConfig(signed,UOption*)::buf;
        options[1].doesOccur = '\x01';
        bVar2 = true;
      }
      icu_63::MaybeStackArray<char,_40>::~MaybeStackArray(&cmdBuf.buffer);
      if (pFVar16 != (FILE *)0x0) {
        pclose(pFVar16);
      }
      if (!bVar2) {
        main_cold_3();
        return 1;
      }
    }
    if (options[0].doesOccur == '\0') {
      main_cold_5();
      return 1;
    }
    if (uVar7 == 1) {
      main_cold_4();
      return 1;
    }
  }
  pcVar20 = options[2].value;
  pcVar34 = options[0].value;
  if ((int)uVar7 < 0 || (!bVar41 || !bVar3)) {
    main_cold_26();
    return 1;
  }
  pcVar38 = options[0xe].value;
  if (options[0xe].doesOccur == '\0') {
    pcVar38 = (char *)0x0;
  }
  sVar15 = strlen(options[0].value);
  buffer = (CharList *)uprv_malloc_63((long)((int)sVar15 + 2));
  cVar32 = *pcVar34;
  pCVar24 = buffer;
  if (cVar32 != '\0') {
    iVar8 = isalpha((int)cVar32);
    cVar25 = '_';
    if (iVar8 != 0) {
      cVar25 = cVar32;
    }
    *(char *)&buffer->str = cVar25;
    pCVar24 = (CharList *)((long)&buffer->str + 1);
    cVar32 = pcVar34[1];
    if (cVar32 != '\0') {
      pcVar29 = pcVar34 + 2;
      do {
        iVar8 = isalnum((int)cVar32);
        cVar25 = '_';
        if (iVar8 != 0) {
          cVar25 = cVar32;
        }
        *(char *)&pCVar24->str = cVar25;
        pCVar24 = (CharList *)((long)&pCVar24->str + 1);
        cVar32 = *pcVar29;
        pcVar29 = pcVar29 + 1;
      } while (cVar32 != '\0');
    }
  }
  *(char *)&pCVar24->str = '\0';
  pcVar29 = pcVar34;
  if (options[0x10].doesOccur != '\0') {
    pcVar29 = options[0x10].value;
  }
  if (options[0x13].doesOccur != '\0') {
    fwrite("Warning: You are using the -z option which only works on z/OS.\n",0x3f,1,_stdout);
  }
  cVar4 = options[0x12].doesOccur;
  cVar25 = options[9].doesOccur;
  cVar32 = options[5].doesOccur;
  l = (CharList *)0x0;
  pcVar28 = (char *)0x0;
  if (options[1].doesOccur != '\0') {
    pcVar28 = options[1].value;
  }
  pcVar31 = (char *)0x0;
  if (options[7].doesOccur != '\0') {
    pcVar31 = options[7].value;
  }
  outComment = 
  " Copyright (C) 2016 and later: Unicode, Inc. and others. License & terms of use: http://www.unicode.org/copyright.html "
  ;
  if (options[6].doesOccur == '\0') {
    outComment = pcVar31;
  }
  pcVar31 = ".";
  if (options[8].doesOccur != '\0') {
    pcVar31 = options[8].value;
  }
  local_6298 = pcVar31;
  if (options[10].doesOccur != '\0') {
    local_6298 = options[10].value;
  }
  installDir = (char *)0x0;
  if (options[0xb].doesOccur != '\0') {
    installDir = options[0xb].value;
  }
  __s = ".";
  if (options[0xc].doesOccur != '\0') {
    __s = options[0xc].value;
  }
  optEntryPoint = buffer;
  if (options[0xd].doesOccur != '\0') {
    optEntryPoint = (CharList *)options[0xd].value;
  }
  tail = (CharList *)0x0;
  if (1 < (int)uVar7) {
    pCVar24 = (CharList *)(ulong)uVar7;
    pCVar35 = (CharList *)0x1;
    l = (CharList *)0x0;
    do {
      pcVar17 = uprv_strdup_63(argv[(long)pCVar35]);
      l = pkg_appendToList(l,&tail,pcVar17);
      pCVar35 = (CharList *)((long)&pCVar35->str + 1);
    } while (pCVar24 != pCVar35);
  }
  cmdBuf.buffer.ptr = (char *)0x0;
  cmd[0] = '\0';
  cmd[1] = '\0';
  cmd[2] = '\0';
  cmd[3] = '\0';
  cmd[4] = '\0';
  cmd[5] = '\0';
  cmd[6] = '\0';
  cmd[7] = '\0';
  bVar41 = true;
  if (l == (CharList *)0x0) {
    local_62f0 = (CharList *)0x0;
    pCVar24 = (CharList *)0x0;
  }
  else {
    local_62f0 = (CharList *)0x0;
    pCVar35 = (CharList *)0x0;
    local_62e8 = (CharList *)((ulong)local_62e8 & 0xffffffff00000000);
    p_Var39 = l;
    do {
      if (cVar32 != '\0') {
        fprintf(_stdout,"# pkgdata: Reading %s..\n",p_Var39->str);
      }
      local_62d8 = T_FileStream_open(p_Var39->str,"r");
      if (local_62d8 == (FileStream *)0x0) {
        main_cold_11();
        bVar41 = false;
        pCVar24 = pCVar35;
        goto LAB_001e85d7;
      }
      pcVar17 = T_FileStream_readLine(local_62d8,dirBuf,0x4000);
      while (pcVar17 != (char *)0x0) {
        iVar8 = (int)local_62e8 + 1;
        uVar37 = (ulong)local_62e8 >> 0x20;
        local_62e8 = (CharList *)CONCAT44((int)uVar37,iVar8);
        sVar15 = strlen(dirBuf);
        pbVar30 = (byte *)(tmpDir + 0x1ff);
        if (0x3fac < sVar15) {
          main_cold_10();
          icu_63::MaybeStackArray<char,_40>::~MaybeStackArray(&cmdBuf.buffer);
          _Unwind_Resume(extraout_RAX);
        }
        do {
          pbVar18 = pbVar30 + 1;
          pbVar30 = pbVar30 + 1;
          iVar10 = isspace((int)(char)*pbVar18);
          pbVar18 = pbVar30;
        } while (iVar10 != 0);
        while( true ) {
          bVar26 = *pbVar18;
          uVar37 = (ulong)bVar26;
          if (bVar26 == 0) break;
          if ((bVar26 == 0xd) || (bVar26 == 10)) {
            *pbVar18 = 0;
            break;
          }
          pbVar18 = pbVar18 + 1;
        }
        if ((*pbVar30 != 0) && (*pbVar30 != 0x23)) {
          do {
            bVar26 = (byte)uVar37;
            pbVar18 = pbVar30;
            if (*pbVar30 == 0) break;
            for (; *pbVar18 == 0x20; pbVar18 = pbVar18 + 1) {
            }
            if (*pbVar18 == 0x22) {
              pcVar17 = strchr((char *)(pbVar18 + 1),0x22);
              if (pcVar17 == (char *)0x0) {
                main_cold_7();
LAB_001e9e92:
                fprintf(_stderr,
                        "%s:%d - malformed quoted line at position %d, expected \' \' got \'%c\'\n",
                        p_Var39->str,iVar8,(ulong)(uint)((int)pbVar30 - (int)dirBuf),
                        (ulong)(uint)(int)(char)bVar26);
                exit(1);
              }
              pbVar30 = (byte *)(pcVar17 + 1);
              bVar26 = pcVar17[1];
              uVar37 = (ulong)bVar26;
              if (bVar26 != 0) {
                if (bVar26 != 0x20) goto LAB_001e9e92;
                pcVar17[1] = '\0';
                pbVar30 = (byte *)(pcVar17 + 2);
              }
            }
            else {
              pcVar17 = strchr((char *)pbVar18,0x20);
              if (pcVar17 == (char *)0x0) {
                pbVar30 = (byte *)0x0;
              }
              else {
                *pcVar17 = '\0';
                pbVar30 = (byte *)(pcVar17 + 1);
              }
            }
            path = (CharList *)getLongPathname((char *)pbVar18);
            pcVar17 = uprv_strdup_63((char *)pbVar18);
            local_62f0 = pkg_appendToList(local_62f0,(CharList **)&cmdBuf,pcVar17);
            UVar5 = uprv_pathIsAbsolute_63((char *)path);
            if ((UVar5 != '\0') || (*(char *)&path->str == '.')) {
              main_cold_9();
              goto LAB_001e9af6;
            }
            sVar15 = strlen(__s);
            sVar19 = strlen((char *)path);
            uVar7 = (int)sVar15 + (int)sVar19 + 5;
            pCVar24 = (CharList *)(ulong)uVar7;
            pcVar17 = (char *)uprv_malloc_63((long)(int)uVar7);
            if (pcVar17 == (char *)0x0) {
              main_cold_8();
              goto LAB_001e9e3c;
            }
            strcpy(pcVar17,__s);
            sVar15 = strlen(__s);
            pcVar33 = "/";
            if (__s[sVar15 - 1] == '/') {
              pcVar33 = "";
            }
            strcat(pcVar17,pcVar33);
            strcat(pcVar17,(char *)path);
            pCVar35 = pkg_appendToList(pCVar35,(CharList **)cmd,pcVar17);
          } while (pbVar30 != (byte *)0x0);
        }
        pcVar17 = T_FileStream_readLine(local_62d8,dirBuf,0x4000);
      }
      T_FileStream_close(local_62d8);
      p_Var39 = p_Var39->next;
    } while (p_Var39 != (_CharList *)0x0);
    bVar41 = true;
    pCVar24 = pCVar35;
  }
LAB_001e85d7:
  if (!bVar41) {
    main_cold_12();
    return 2;
  }
  bVar26 = *pcVar20;
  local_62d8 = (FileStream *)(ulong)bVar26;
  memset(targetDir,0,0x200);
  memset(tmpDir,0,0x200);
  memset(datFileName,0,0x200);
  memset(&cmdBuf,0,0x800);
  memset(cmd,0,0x800);
  dirBuf[0] = '\0';
  dirBuf[1] = '\0';
  dirBuf[2] = '\0';
  dirBuf[3] = '\0';
  pkgDataFlags = (char **)uprv_malloc_63(0x88);
  iVar8 = 0x200;
  do {
    if (pkgDataFlags == (char **)0x0) {
      main_cold_14();
      break;
    }
    lVar36 = 0;
    do {
      pcVar20 = (char *)uprv_malloc_63((long)iVar8);
      pkgDataFlags[lVar36] = pcVar20;
      if (pcVar20 == (char *)0x0) {
        main_cold_13();
        goto LAB_001e87f9;
      }
      *pcVar20 = '\0';
      lVar36 = lVar36 + 1;
    } while (lVar36 != 0x11);
    if (pcVar28 == (char *)0x0) break;
    if (cVar32 != '\0') {
      fprintf(_stdout,"# Reading options file %s\n",pcVar28);
    }
    dirBuf[0] = '\0';
    dirBuf[1] = '\0';
    dirBuf[2] = '\0';
    dirBuf[3] = '\0';
    iVar11 = parseFlagsFile(pcVar28,pkgDataFlags,iVar8,FLAG_NAMES,0x11,(UErrorCode *)dirBuf);
    pFVar14 = _stderr;
    if (dirBuf._0_4_ == 0xf) {
      lVar36 = 0;
      do {
        if (pkgDataFlags[lVar36] != (char *)0x0) {
          uprv_free_63(pkgDataFlags[lVar36]);
          pkgDataFlags[lVar36] = (char *)0x0;
        }
        lVar36 = lVar36 + 1;
        iVar8 = iVar11;
      } while (lVar36 != 0x11);
    }
    else if (0 < (int)dirBuf._0_4_) {
      pcVar20 = u_errorName_63(dirBuf._0_4_);
      fprintf(pFVar14,"Unable to open or read \"%s\" option file. status = %s\n",pcVar28,pcVar20);
      break;
    }
    if (cVar32 != '\0') {
      fwrite("# pkgDataFlags=\n",0x10,1,_stdout);
      ppcVar40 = FLAG_NAMES;
      uVar37 = 0;
      do {
        fprintf(_stdout,"  [%d] %s:  %s\n",uVar37 & 0xffffffff,*ppcVar40);
        uVar37 = uVar37 + 1;
        ppcVar40 = ppcVar40 + 1;
      } while (uVar37 != 0x11);
      fputc(10,_stdout);
    }
  } while (dirBuf._0_4_ == 0xf);
LAB_001e87f9:
  local_62e8 = pCVar24;
  if (bVar26 == 0x66) {
    if (installDir == (char *)0x0) {
      iVar8 = 0;
    }
    else {
      strcpy(targetDir,installDir);
      sVar15 = strlen(targetDir);
      (targetDir + sVar15)[0] = '/';
      (targetDir + sVar15)[1] = '\0';
      strcat(targetDir,pcVar34);
      if (cVar32 != '\0') {
        fprintf(_stdout,"# Install: Files mode, copying files to %s..\n",targetDir);
      }
      pcVar34 = l->str;
      memset(dirBuf,0,0x200);
      UVar5 = T_FileStream_file_exists(targetDir);
      if (UVar5 == '\0') {
        _status_1 = (char *)((ulong)_status_1 & 0xffffffff00000000);
        uprv_mkdir(targetDir,&status_1);
        if (U_ZERO_ERROR < status_1) {
          fprintf(_stderr,"Error creating installation directory: %s\n",targetDir);
          iVar8 = -1;
          goto LAB_001e8cb1;
        }
      }
      memset(&status_1,0,0x200);
      pFVar21 = T_FileStream_open(pcVar34,"r");
      if (pFVar21 == (FileStream *)0x0) {
        fprintf(_stderr,"Unable to open list file: %s\n",pcVar34);
        iVar8 = -1;
      }
      else {
        do {
          pcVar20 = T_FileStream_readLine(pFVar21,(char *)&status_1,0x200);
          if (pcVar20 == (char *)0x0) {
            iVar10 = T_FileStream_eof(pFVar21);
            iVar8 = 0;
            if (iVar10 == 0) {
              fprintf(_stderr,"Failed to read line from file: %s\n",pcVar34);
              iVar8 = -1;
            }
            goto LAB_001e8c35;
          }
          sVar15 = strlen((char *)&status_1);
          if (0 < (int)sVar15) {
            *(undefined1 *)((long)&status_1 + (ulong)((int)sVar15 - 1)) = 0;
          }
          UVar5 = -0x70;
          sprintf(dirBuf,"%s %s%s%s %s%s%s",pkgDataFlags[0x10],__s,"/",&status_1,targetDir,"/",
                  &status_1);
          iVar8 = runCommand(dirBuf,UVar5);
        } while (iVar8 == 0);
        fprintf(_stderr,"Failed to install data file with command: %s\n",dirBuf);
LAB_001e8c35:
        T_FileStream_close(pFVar21);
      }
    }
    goto LAB_001e8cb1;
  }
  strcpy(targetDir,pcVar31);
  sVar15 = strlen(targetDir);
  (targetDir + sVar15)[0] = '/';
  (targetDir + sVar15)[1] = '\0';
  strcpy(tmpDir,local_6298);
  sVar15 = strlen(tmpDir);
  (tmpDir + sVar15)[0] = '/';
  (tmpDir + sVar15)[1] = '\0';
  strcpy((char *)&cmdBuf,tmpDir);
  strcpy(datFileName,pcVar34);
  sVar15 = strlen(datFileName);
  builtin_strncpy(datFileName + sVar15,".dat",5);
  strcat((char *)&cmdBuf,datFileName);
  if (cVar32 != '\0') {
    fprintf(_stdout,"# Writing package file %s ..\n",&cmdBuf);
  }
  iVar8 = writePackageDatFile((char *)&cmdBuf,outComment,__s,l->str,(Package *)0x0,'l');
  if (iVar8 != 0) {
    main_cold_15();
    goto LAB_001e8cb1;
  }
  if ((bVar26 & 0xfd) == 0x61) {
    memset(dirBuf,0,0x800);
    strcpy(dirBuf,targetDir);
    strcat(dirBuf,datFileName);
    iVar8 = strcmp((char *)&cmdBuf,dirBuf);
    if (iVar8 != 0) {
      UVar5 = T_FileStream_file_exists(dirBuf);
      if ((UVar5 != '\0') && (iVar8 = remove(dirBuf), iVar8 != 0)) {
        fprintf(_stderr,"Unable to remove old dat file: %s\n",dirBuf);
        goto LAB_001e8cb1;
      }
      iVar8 = rename((char *)&cmdBuf,dirBuf);
      if (cVar32 != '\0') {
        fprintf(_stdout,"# Moving package file to %s ..\n",dirBuf);
      }
      if (iVar8 != 0) {
        fprintf(_stderr,"Unable to move dat file (%s) to target location (%s).\n",&cmdBuf,dirBuf);
        goto LAB_001e8cb1;
      }
    }
    iVar8 = 0;
    if (installDir != (char *)0x0) {
      memset(&status_1,0,0x200);
      UVar5 = T_FileStream_file_exists(installDir);
      if (UVar5 == '\0') {
        newName[0] = '\0';
        newName[1] = '\0';
        newName[2] = '\0';
        newName[3] = '\0';
        uprv_mkdir(installDir,(UErrorCode *)newName);
        if (0 < (int)newName._0_4_) {
          fprintf(_stderr,"Error creating installation directory: %s\n",installDir);
          iVar8 = -1;
          goto LAB_001e8cb1;
        }
      }
      UVar5 = 'd';
      sprintf((char *)&status_1,"%s %s %s",pkgDataFlags[0x10],dirBuf,installDir);
      iVar8 = runCommand((char *)&status_1,UVar5);
      if (iVar8 != 0) {
        fprintf(_stderr,"Failed to install data file with command: %s\n",&status_1);
      }
    }
    goto LAB_001e8cb1;
  }
  memset(gencFilePath,0,0x200);
  version_major[8] = '\0';
  version_major[9] = '\0';
  version_major[0] = '\0';
  version_major[1] = '\0';
  version_major[2] = '\0';
  version_major[3] = '\0';
  version_major[4] = '\0';
  version_major[5] = '\0';
  version_major[6] = '\0';
  version_major[7] = '\0';
  if (pcVar38 == (char *)0x0) {
    local_62cc = '\x01';
    if ((bVar26 & 0xf7) == 100) {
      fwrite("Warning: Providing a revision number with the -r option is recommended when packaging data in the current mode.\n"
             ,0x70,1,_stdout);
    }
  }
  else {
    lVar36 = 0;
    do {
      if (pcVar38[lVar36] == '.') {
        version_major[lVar36] = '\0';
        break;
      }
      version_major[lVar36] = pcVar38[lVar36];
      lVar36 = lVar36 + 1;
    } while (lVar36 != 10);
    local_62cc = '\0';
  }
  ppcVar40 = pkgDataFlags;
  pcVar20 = pkgDataFlags[5];
  sVar15 = strlen(pcVar20);
  local_62f9 = pcVar20[sVar15 - 1];
  pcVar31 = ppcVar40[1];
  sVar15 = strlen(pcVar31);
  local_62fa = pcVar31[sVar15 - 1];
  pcVar17 = pcVar38;
  if (pcVar38 == (char *)0x0) {
    pcVar17 = "";
  }
  pcVar33 = ".";
  if (*pcVar31 == '\0') {
    pcVar33 = "";
  }
  pcVar31 = "";
  if (*pcVar20 == '.') {
    pcVar31 = ".";
  }
  sprintf(libFileNames[0],"%s%s",ppcVar40[4],pcVar29);
  if (cVar32 != '\0') {
    fprintf(_stdout,"# libFileName[LIB_FILE] = %s\n",libFileNames);
  }
  if (pcVar38 == (char *)0x0 && local_62f9 != local_62fa) {
    sprintf(libFileNames[3],"%s%s%s",libFileNames,pcVar31,pkgDataFlags[2]);
  }
  else {
    if (local_62f9 == local_62fa) {
      pcVar20 = pkgDataFlags[2];
      pcVar29 = pcVar17;
    }
    else {
      pcVar20 = pcVar17;
      pcVar29 = pkgDataFlags[2];
    }
    sprintf(libFileNames[3],"%s%s%s%s%s",libFileNames,pcVar31,pcVar29,pcVar33,pcVar20);
  }
  if (pcVar38 == (char *)0x0 && local_62f9 != local_62fa) {
    sprintf(libFileNames[1],"%s%s%s",libFileNames,pcVar31,pkgDataFlags[1]);
    UVar5 = (UBool)pkgDataFlags[1];
    sprintf(libFileNames[2],"%s%s%s",libFileNames,pcVar31);
  }
  else {
    if (local_62f9 == local_62fa) {
      sprintf(libFileNames[1],"%s%s%s%s%s",libFileNames,pcVar31,version_major,pcVar33,
              pkgDataFlags[1]);
      pcVar20 = pkgDataFlags[1];
    }
    else {
      sprintf(libFileNames[1],"%s%s%s%s%s",libFileNames,pcVar31,pkgDataFlags[1],pcVar33,
              version_major);
      pcVar20 = pcVar17;
      pcVar17 = pkgDataFlags[1];
    }
    sprintf(libFileNames[2],"%s%s%s%s%s",libFileNames,pcVar31,pcVar17,pcVar33,pcVar20);
    UVar5 = (UBool)pcVar17;
  }
  if (cVar32 != '\0') {
    fprintf(_stdout,"# libFileName[LIB_FILE_VERSION] = %s\n",0x407d40);
  }
  if (bVar26 == 0x73) {
    sprintf(libFileNames[2],"%s.%s",libFileNames,pkgDataFlags[3]);
    libFileNames[1][0] = '\0';
    if (cVar32 != '\0') {
      fprintf(_stdout,"# libFileName[LIB_FILE_VERSION] = %s  (static)\n",0x407d40);
    }
  }
  if ((pcVar38 == (char *)0x0 && bVar26 != 0x73) || (cVar25 != '\0')) {
LAB_001e91a5:
    local_62d8._0_1_ = bVar26;
    if ((cVar4 == '\0') && (pcVar20 = *pkgDataFlags, *pcVar20 != '\0')) {
      if (cVar32 != '\0') {
        fprintf(_stdout,"# Generating assembly code %s of type %s ..\n",gencFilePath);
      }
      sVar15 = strlen(pcVar20);
      if ((sVar15 < 4) || (UVar5 = checkAssemblyHeaderName(pcVar20 + 3), UVar5 == '\0')) {
        iVar10 = 0;
        fprintf(_stderr,"Assembly type \"%s\" is unknown.\n",pcVar20);
        iVar8 = -1;
        bVar41 = false;
      }
      else {
        writeAssemblyCode((char *)&cmdBuf,local_6298,(char *)optEntryPoint,(char *)0x0,gencFilePath)
        ;
        __s = dirBuf;
        memset(__s,0,0x200);
        strcpy(__s,gencFilePath);
        sVar15 = strlen(__s);
        ppcVar40 = pkgDataFlags;
        __s[sVar15 - 1] = 'o';
        sVar15 = strlen(pkgDataFlags[6]);
        sVar19 = strlen(ppcVar40[7]);
        sVar22 = strlen(__s);
        sVar23 = strlen(gencFilePath);
        pCVar24 = (CharList *)
                  uprv_malloc_63((long)((int)sVar23 + (int)sVar22 + (int)sVar19 + (int)sVar15 + 0x14
                                       ));
        if (pCVar24 == (CharList *)0x0) {
          iVar11 = -1;
        }
        else {
          UVar5 = -9;
          pcVar34 = dirBuf;
          sprintf((char *)pCVar24,"%s %s -o %s %s",pkgDataFlags[6],pkgDataFlags[7],pcVar34,
                  gencFilePath);
          UVar6 = (UBool)pcVar34;
          uVar7 = runCommand((char *)pCVar24,UVar5);
          pbVar30 = (byte *)(ulong)uVar7;
          uprv_free_63(pCVar24);
          pCVar35 = local_62f0;
          path = buffer;
          if (uVar7 == 0) {
            iVar11 = pkg_generateLibraryFile(targetDir,bVar26,dirBuf,(char *)0x0,UVar6);
          }
          else {
LAB_001e9e3c:
            iVar11 = (int32_t)pbVar30;
            fprintf(_stderr,"Error creating with assembly code. Failed command: %s\n",pCVar24);
            local_62f0 = pCVar35;
            buffer = path;
          }
        }
        iVar8 = (int)__s;
        if (iVar11 == 0) {
          if ((byte)local_62d8 == 0x73) {
            if (installDir != (char *)0x0) {
              if (cVar32 != '\0') {
                fprintf(_stdout,"# Installing static library into %s\n",installDir);
              }
              iVar8 = pkg_installLibrary(installDir,targetDir,local_62cc);
              goto LAB_001e9950;
            }
            iVar10 = 0;
            bVar41 = false;
            iVar8 = 0;
          }
          else {
            bVar41 = true;
            iVar10 = 0;
          }
        }
        else {
          main_cold_16();
          iVar8 = iVar11;
LAB_001e9950:
          bVar41 = false;
          iVar10 = iVar8;
        }
      }
      pCVar24 = local_62e8;
      if (!bVar41) goto LAB_001e8cb1;
    }
    else {
      if (cVar32 != '\0') {
        fprintf(_stdout,"# Writing object code to %s ..\n",gencFilePath);
      }
      if (cVar4 == '\0') {
        local_6030 = local_6030 & 0xffff0000;
        _status_1 = (char *)0x0;
        pFVar21 = T_FileStream_open("oma.c","w");
        if (pFVar21 == (FileStream *)0x0) {
LAB_001e9af6:
          main_cold_21();
        }
        else {
          T_FileStream_writeLine(pFVar21,"void oma(){}");
          T_FileStream_close(pFVar21);
          UVar5 = -3;
          sprintf(dirBuf,"%s %s -o %s",pkgDataFlags[6],"oma.c");
          iVar8 = runCommand(dirBuf,UVar5);
          if (iVar8 == 0) {
            _status_1 = (char *)0x6a626f2e616d6f;
          }
          else {
            main_cold_19();
          }
          UVar5 = T_FileStream_remove("oma.c");
          if (UVar5 == '\0') {
            main_cold_20();
          }
        }
        pUVar27 = &status_1;
        if ((undefined1)status_1 == U_ZERO_ERROR) {
          pUVar27 = (UErrorCode *)0x0;
        }
        UVar6 = '\0';
        writeObjectCode((char *)&cmdBuf,local_6298,(char *)optEntryPoint,(char *)pUVar27,(char *)0x0
                        ,gencFilePath);
        UVar5 = T_FileStream_file_exists((char *)&status_1);
        if ((UVar5 != '\0') && (UVar5 = T_FileStream_remove((char *)&status_1), UVar5 == '\0')) {
          fprintf(_stderr,"T_FileStream_remove failed to delete %s\n",&status_1);
        }
        iVar8 = pkg_generateLibraryFile(targetDir,(byte)local_62d8,gencFilePath,(char *)0x0,UVar6);
      }
      else {
        uVar12 = pkg_countCharList(pCVar24);
        memset(dirBuf,0,0x200);
        memset(&status_1,0,0x200);
        iVar8 = -1;
        if ((pCVar24 != (CharList *)0x0) && (local_62f0 != (CharList *)0x0)) {
          pcVar20 = (char *)uprv_malloc_63((long)(int)(uVar12 * 0x200 + 0x400));
          if (pcVar20 == (char *)0x0) {
            main_cold_18();
          }
          else {
            pcVar29 = (char *)uprv_malloc_63((long)(int)(uVar12 * 0x200 + 0x200));
            if (pcVar29 == (char *)0x0) {
              main_cold_17();
            }
            else {
              if (-1 < (int)uVar12) {
                local_6288 = local_62f0;
                local_62c0 = pCVar24;
                uVar13 = 0;
LAB_001e92b3:
                if (uVar13 != 0) {
                  pcVar28 = local_62c0->str;
                  pcVar31 = local_6288->str;
                  dataName[0] = '\0';
                  newName._0_4_ = newName._0_4_ & 0xffffff00;
                  uVar37 = 0;
LAB_001e92f1:
                  status = status & 0xffffff00;
                  pacVar1 = DATA_PREFIX + uVar37;
                  sprintf((char *)&status,"%s%s",pacVar1);
                  pcVar17 = strstr(pcVar31,(char *)&status);
                  if (pcVar17 != (char *)0x0) {
                    memset(local_4c38,0,0x200);
                    sVar15 = strlen((char *)&status);
                    lVar36 = 0;
                    do {
                      if (pcVar31[lVar36 + sVar15] == '.') {
                        local_4c38[lVar36] = '_';
                      }
                      else {
                        local_4c38[lVar36] = pcVar31[lVar36 + sVar15];
                        if (pcVar31[lVar36 + sVar15] == '\0') goto LAB_001e9378;
                      }
                      lVar36 = lVar36 + 1;
                    } while( true );
                  }
                  goto LAB_001e93af;
                }
                createCommonDataFile
                          (local_6298,pcVar34,(char *)optEntryPoint,(char *)0x0,__s,outComment,
                           l->str,0,'\x01',cVar32,dirBuf);
                *pcVar29 = '\0';
                goto LAB_001e947f;
              }
              iVar8 = 0;
LAB_001e989a:
              if (iVar8 == 0) {
                iVar8 = pkg_generateLibraryFile(targetDir,bVar26,pcVar29,pcVar20,UVar5);
              }
              uprv_free_63(pcVar29);
              uprv_free_63(pcVar20);
            }
          }
        }
      }
      iVar10 = 0;
      if (iVar8 != 0) {
        main_cold_22();
        local_62e8 = pCVar24;
        goto LAB_001e8cb1;
      }
    }
    if ((byte)local_62d8 != 0x73) {
      if (cVar32 != '\0') {
        fwrite("# Creating data archive library file ..\n",0x28,1,_stdout);
      }
      ppcVar40 = pkgDataFlags;
      pcVar34 = pkgDataFlags[1];
      iVar8 = strcmp(pkgDataFlags[2],pcVar34);
      if ((iVar8 == 0) || (iVar8 = strcmp(ppcVar40[3],pcVar34), iVar8 != 0)) {
        UVar5 = '@';
        strcpy(libFileNames[2],libFileNames[3]);
        iVar8 = 0;
      }
      else {
        pcVar20 = "";
        if (*ppcVar40[5] == '.') {
          pcVar20 = ".";
        }
        pcVar28 = pcVar34;
        pcVar29 = pcVar38;
        if (local_62f9 != local_62fa) {
          pcVar28 = pcVar38;
          pcVar29 = pcVar34;
        }
        sprintf(libFileNames[2],"%s%s%s.%s",libFileNames,pcVar20,pcVar29,pcVar28);
        UVar5 = '\b';
        sprintf(dirBuf,"%s %s %s%s %s%s",pkgDataFlags[0xd],pkgDataFlags[0xe],targetDir,0x407d40,
                targetDir,0x407e40);
        iVar8 = runCommand(dirBuf,UVar5);
        if (iVar8 == 0) {
          UVar5 = '\x10';
          sprintf(dirBuf,"%s %s%s",pkgDataFlags[0xf],targetDir,0x407d40);
          iVar10 = runCommand(dirBuf,UVar5);
          if (iVar10 == 0) {
            UVar5 = '\x10';
            sprintf(dirBuf,"%s %s%s","rm -f",targetDir,0x407e40);
            iVar10 = runCommand(dirBuf,UVar5);
            iVar8 = 0;
            if (iVar10 == 0) goto LAB_001e9d23;
          }
          UVar5 = '\x18';
          fprintf(_stderr,"Error creating archive library. Failed command: %s\n",dirBuf);
          iVar8 = iVar10;
        }
        else {
          UVar5 = '\x18';
          fprintf(_stderr,"Error creating archive library. Failed command: %s\n",dirBuf);
        }
      }
LAB_001e9d23:
      if (iVar8 != 0) {
        main_cold_23();
        goto LAB_001e8cb1;
      }
      pCVar24 = local_62e8;
      iVar10 = 0;
      if ((pcVar38 != (char *)0x0) && (iVar8 = pkg_createSymLinks(targetDir,UVar5), iVar8 != 0)) {
        main_cold_24();
        goto LAB_001e8cb1;
      }
    }
    iVar8 = iVar10;
    local_62e8 = pCVar24;
    if (installDir == (char *)0x0) goto LAB_001e8cb1;
    if (cVar32 != '\0') {
      fprintf(_stdout,"# Installing library file to %s ..\n",installDir);
    }
    iVar8 = pkg_installLibrary(installDir,targetDir,local_62cc);
    if (iVar8 != 0) {
      main_cold_25();
      goto LAB_001e8cb1;
    }
  }
  else {
    sprintf(cmd,"%s%s",targetDir,0x407d40);
    UVar6 = T_FileStream_file_exists(cmd);
    if (UVar6 == '\0') {
      if (installDir != (char *)0x0 && cVar32 != '\0') {
        pcVar20 = "# Not installing missing %s into %s\n";
LAB_001e918d:
        fprintf(_stdout,pcVar20,cmd);
      }
      goto LAB_001e91a5;
    }
    UVar6 = isFileModTimeLater(cmd,__s,'\x01');
    if ((UVar6 == '\0') || (UVar6 = isFileModTimeLater(cmd,pcVar28,'\0'), UVar6 == '\0')) {
      if (installDir != (char *)0x0 && cVar32 != '\0') {
        pcVar20 = "# Not installing up-to-date library %s into %s\n";
        goto LAB_001e918d;
      }
      goto LAB_001e91a5;
    }
    if (installDir != (char *)0x0) {
      if (cVar32 != '\0') {
        fprintf(_stdout,"# Installing already-built library into %s\n",installDir);
      }
      iVar8 = pkg_installLibrary(installDir,targetDir,local_62cc);
      goto LAB_001e8cb1;
    }
    if (cVar32 != '\0') {
      iVar8 = 0;
      printf("# Not rebuilding %s - up to date.\n",cmd);
      goto LAB_001e8cb1;
    }
  }
  iVar8 = 0;
  local_62e8 = pCVar24;
LAB_001e8cb1:
  if (pkgDataFlags != (char **)0x0) {
    lVar36 = 0;
    do {
      if (pkgDataFlags[lVar36] != (char *)0x0) {
        uprv_free_63(pkgDataFlags[lVar36]);
      }
      lVar36 = lVar36 + 1;
    } while (lVar36 != 0x11);
    uprv_free_63(pkgDataFlags);
  }
  if (buffer != (CharList *)0x0) {
    uprv_free_63(buffer);
  }
  if (l != (CharList *)0x0) {
    pkg_deleteList(l);
  }
  if (local_62e8 != (CharList *)0x0) {
    pkg_deleteList(local_62e8);
  }
  if (local_62f0 != (CharList *)0x0) {
    pkg_deleteList(local_62f0);
    return iVar8;
  }
  return iVar8;
LAB_001e9378:
  sprintf(newName,"%s_%s",pacVar1,local_4c38);
  sprintf(dataName,"%s_%s",pcVar34,pacVar1);
LAB_001e93af:
  if (7 < uVar37) goto LAB_001e93c6;
  uVar37 = uVar37 + 1;
  if (newName[0] != '\0') goto LAB_001e93c6;
  goto LAB_001e92f1;
LAB_001e93c6:
  if (cVar32 != '\0') {
    printf("# Generating %s \n",dirBuf);
  }
  pcVar31 = dataName;
  if (dataName[0] == '\0') {
    pcVar31 = pcVar34;
  }
  pcVar17 = newName;
  if (newName[0] == '\0') {
    pcVar17 = (char *)0x0;
  }
  writeCCode(pcVar28,local_6298,pcVar31,pcVar17,dirBuf);
LAB_001e947f:
  strcpy((char *)&status_1,dirBuf);
  sVar15 = strlen((char *)&status_1);
  *(undefined1 *)((sVar15 - 1) + (long)&status_1) = 0x6f;
  UVar6 = -9;
  pUVar27 = &status_1;
  sprintf(pcVar20,"%s %s -o %s %s",pkgDataFlags[6],pkgDataFlags[7],&status_1,dirBuf);
  UVar5 = (UBool)pUVar27;
  iVar8 = runCommand(pcVar20,UVar6);
  if (iVar8 == 0) {
    sVar15 = strlen(pcVar29);
    (pcVar29 + sVar15)[0] = ' ';
    (pcVar29 + sVar15)[1] = '\0';
    strcat(pcVar29,(char *)&status_1);
    if (uVar13 != 0) {
      local_62c0 = local_62c0->next;
      local_6288 = local_6288->next;
    }
  }
  else {
    fprintf(_stderr,"Error creating library without assembly code. Failed command: %s\n",pcVar20);
  }
  if ((iVar8 != 0) || (bVar41 = uVar13 == uVar12, uVar13 = uVar13 + 1, bVar41)) goto LAB_001e989a;
  goto LAB_001e92b3;
}

Assistant:

int
main(int argc, char* argv[]) {
    int result = 0;
    /* FileStream  *out; */
    UPKGOptions  o;
    CharList    *tail;
    UBool        needsHelp = FALSE;
    UErrorCode   status = U_ZERO_ERROR;
    /* char         tmp[1024]; */
    uint32_t i;
    int32_t n;

    U_MAIN_INIT_ARGS(argc, argv);

    progname = argv[0];

    options[MODE].value = "common";

    /* read command line options */
    argc=u_parseArgs(argc, argv, UPRV_LENGTHOF(options), options);

    /* error handling, printing usage message */
    /* I've decided to simply print an error and quit. This tool has too
    many options to just display them all of the time. */

    if(options[HELP].doesOccur || options[HELP_QUESTION_MARK].doesOccur) {
        needsHelp = TRUE;
    }
    else {
        if(!needsHelp && argc<0) {
            fprintf(stderr,
                "%s: error in command line argument \"%s\"\n",
                progname,
                argv[-argc]);
            fprintf(stderr, "Run '%s --help' for help.\n", progname);
            return 1;
        }


#if !defined(WINDOWS_WITH_MSVC) || defined(USING_CYGWIN)
        if(!options[BLDOPT].doesOccur && uprv_strcmp(options[MODE].value, "common") != 0) {
          if (pkg_getOptionsFromICUConfig(options[VERBOSE].doesOccur, &options[BLDOPT]) != 0) {
                fprintf(stderr, " required parameter is missing: -O is required for static and shared builds.\n");
                fprintf(stderr, "Run '%s --help' for help.\n", progname);
                return 1;
            }
        }
#else
        if(options[BLDOPT].doesOccur) {
            fprintf(stdout, "Warning: You are using the -O option which is not needed for MSVC build on Windows.\n");
        }
#endif

        if(!options[NAME].doesOccur) /* -O we already have - don't report it. */
        {
            fprintf(stderr, " required parameter -p is missing \n");
            fprintf(stderr, "Run '%s --help' for help.\n", progname);
            return 1;
        }

        if(argc == 1) {
            fprintf(stderr,
                "No input files specified.\n"
                "Run '%s --help' for help.\n", progname);
            return 1;
        }
    }   /* end !needsHelp */

    if(argc<0 || needsHelp  ) {
        fprintf(stderr,
            "usage: %s [-options] [-] [packageFile] \n"
            "\tProduce packaged ICU data from the given list(s) of files.\n"
            "\t'-' by itself means to read from stdin.\n"
            "\tpackageFile is a text file containing the list of files to package.\n",
            progname);

        fprintf(stderr, "\n options:\n");
        for(i=0;i<UPRV_LENGTHOF(options);i++) {
            fprintf(stderr, "%-5s -%c %s%-10s  %s\n",
                (i<1?"[REQ]":""),
                options[i].shortName,
                options[i].longName ? "or --" : "     ",
                options[i].longName ? options[i].longName : "",
                options_help[i]);
        }

        fprintf(stderr, "modes: (-m option)\n");
        for(i=0;i<UPRV_LENGTHOF(modes);i++) {
            fprintf(stderr, "   %-9s ", modes[i].name);
            if (modes[i].alt_name) {
                fprintf(stderr, "/ %-9s", modes[i].alt_name);
            } else {
                fprintf(stderr, "           ");
            }
            fprintf(stderr, "  %s\n", modes[i].desc);
        }
        return 1;
    }

    /* OK, fill in the options struct */
    uprv_memset(&o, 0, sizeof(o));

    o.mode      = options[MODE].value;
    o.version   = options[REVISION].doesOccur ? options[REVISION].value : 0;

    o.shortName = options[NAME].value;
    {
        int32_t len = (int32_t)uprv_strlen(o.shortName);
        char *csname, *cp;
        const char *sp;

        cp = csname = (char *) uprv_malloc((len + 1 + 1) * sizeof(*o.cShortName));
        if (*(sp = o.shortName)) {
            *cp++ = isalpha(*sp) ? * sp : '_';
            for (++sp; *sp; ++sp) {
                *cp++ = isalnum(*sp) ? *sp : '_';
            }
        }
        *cp = 0;

        o.cShortName = csname;
    }

    if(options[LIBNAME].doesOccur) { /* get libname from shortname, or explicit -L parameter */
      o.libName = options[LIBNAME].value;
    } else {
      o.libName = o.shortName;
    }

    if(options[QUIET].doesOccur) {
      o.quiet = TRUE;
    } else {
      o.quiet = FALSE;
    }

    if(options[PDS_BUILD].doesOccur) {
#if U_PLATFORM == U_PF_OS390
      o.pdsbuild = TRUE;
#else
      o.pdsbuild = FALSE;
      fprintf(stdout, "Warning: You are using the -z option which only works on z/OS.\n");

#endif
    } else {
      o.pdsbuild = FALSE;
    }

    o.verbose   = options[VERBOSE].doesOccur;


#if !defined(WINDOWS_WITH_MSVC) || defined(USING_CYGWIN) /* on UNIX, we'll just include the file... */
    if (options[BLDOPT].doesOccur) {
        o.options   = options[BLDOPT].value;
    } else {
        o.options = NULL;
    }
#endif
    if(options[COPYRIGHT].doesOccur) {
        o.comment = U_COPYRIGHT_STRING;
    } else if (options[COMMENT].doesOccur) {
        o.comment = options[COMMENT].value;
    }

    if( options[DESTDIR].doesOccur ) {
        o.targetDir = options[DESTDIR].value;
    } else {
        o.targetDir = ".";  /* cwd */
    }

    o.rebuild   = options[REBUILD].doesOccur;

    if( options[TEMPDIR].doesOccur ) {
        o.tmpDir    = options[TEMPDIR].value;
    } else {
        o.tmpDir    = o.targetDir;
    }

    if( options[INSTALL].doesOccur ) {
        o.install  = options[INSTALL].value;
    } else {
        o.install = NULL;
    }

    if( options[SOURCEDIR].doesOccur ) {
        o.srcDir   = options[SOURCEDIR].value;
    } else {
        o.srcDir   = ".";
    }

    if( options[ENTRYPOINT].doesOccur ) {
        o.entryName = options[ENTRYPOINT].value;
    } else {
        o.entryName = o.cShortName;
    }

    o.withoutAssembly = FALSE;
    if (options[WITHOUT_ASSEMBLY].doesOccur) {
#ifndef BUILD_DATA_WITHOUT_ASSEMBLY
        fprintf(stdout, "Warning: You are using the option to build without assembly code which is not supported on this platform.\n");
        fprintf(stdout, "Warning: This option will be ignored.\n");
#else
        o.withoutAssembly = TRUE;
#endif
    }

    /* OK options are set up. Now the file lists. */
    tail = NULL;
    for( n=1; n<argc; n++) {
        o.fileListFiles = pkg_appendToList(o.fileListFiles, &tail, uprv_strdup(argv[n]));
    }

    /* load the files */
    loadLists(&o, &status);
    if( U_FAILURE(status) ) {
        fprintf(stderr, "error loading input file lists: %s\n", u_errorName(status));
        return 2;
    }

    result = pkg_executeOptions(&o);

    if (pkgDataFlags != NULL) {
        for (n = 0; n < PKGDATA_FLAGS_SIZE; n++) {
            if (pkgDataFlags[n] != NULL) {
                uprv_free(pkgDataFlags[n]);
            }
        }
        uprv_free(pkgDataFlags);
    }

    if (o.cShortName != NULL) {
        uprv_free((char *)o.cShortName);
    }
    if (o.fileListFiles != NULL) {
        pkg_deleteList(o.fileListFiles);
    }
    if (o.filePaths != NULL) {
        pkg_deleteList(o.filePaths);
    }
    if (o.files != NULL) {
        pkg_deleteList(o.files);
    }

    return result;
}